

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void flatviews_init(uc_struct_conflict15 *uc)

{
  GHashTable *pGVar1;
  FlatView *value;
  
  if (uc->flat_views == (GHashTable *)0x0) {
    pGVar1 = g_hash_table_new_full
                       ((GHashFunc)0x0,(GEqualFunc)0x0,(GDestroyNotify)0x0,flatview_unref_tricore);
    uc->flat_views = pGVar1;
    if (uc->empty_view == (FlatView *)0x0) {
      value = generate_memory_topology(uc,(MemoryRegion_conflict *)0x0);
      uc->empty_view = value;
      value->ref = value->ref + 1;
      g_hash_table_replace(uc->flat_views,(gpointer)0x0,value);
      return;
    }
  }
  return;
}

Assistant:

static void flatviews_init(struct uc_struct *uc)
{
    if (uc->flat_views) {
        return;
    }

    uc->flat_views = g_hash_table_new_full(NULL, NULL, NULL,
                                       (GDestroyNotify) flatview_unref);

    if (!uc->empty_view) {
        uc->empty_view = generate_memory_topology(uc, NULL);
        /* We keep it alive forever in the global variable.  */
        flatview_ref(uc->empty_view);
        g_hash_table_replace(uc->flat_views, NULL, uc->empty_view);
    }
}